

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

int __thiscall crnlib::rg_etc1::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  uint16 *pKeys;
  undefined8 uVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  undefined1 auVar8 [13];
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint i_2;
  long lVar12;
  results *in_RDX;
  long lVar13;
  uint i_1;
  long lVar14;
  uint i_3;
  uint32 (*pIndices0) [8];
  float fVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar20;
  undefined1 auVar19 [16];
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  uVar9 = ((byte)ctx[0x18] ^ 1) << 4;
  uVar10 = uVar9 | 0xf;
  this->m_limit = uVar10;
  local_48 = 0;
  local_40 = 0.0;
  lVar12 = *(long *)(ctx + 0x10);
  pKeys = this->m_luma;
  pIndices0 = this->m_sorted_luma;
  lVar13 = 0;
  do {
    bVar2 = *(byte *)(lVar12 + 2 + lVar13 * 4);
    uVar3 = *(undefined4 *)(lVar12 + lVar13 * 4);
    uVar7 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar7;
    auVar4[0xc] = (char)((uint)uVar3 >> 0x18);
    auVar5[8] = (char)((uint)uVar3 >> 0x10);
    auVar5._0_8_ = uVar7;
    auVar5[9] = 0;
    auVar5._10_3_ = auVar4._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar5._8_5_;
    auVar6[4] = (char)((uint)uVar3 >> 8);
    auVar6._0_4_ = (int)uVar7;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar8 << 0x40,6);
    local_38 = CONCAT44((float)auVar6._4_4_,(float)(int)uVar7);
    local_30 = (float)bVar2;
    lVar14 = 0;
    do {
      *(float *)((long)&local_48 + lVar14 * 4) =
           *(float *)((long)&local_38 + lVar14 * 4) + *(float *)((long)&local_48 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pKeys[lVar13] = ((ushort)uVar3 & 0xff) + (ushort)bVar2 + ((ushort)((uint)uVar3 >> 8) & 0xff);
    (*pIndices0)[lVar13] = (uint32)lVar13;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 8);
  lVar12 = 0;
  do {
    *(float *)((long)&local_48 + lVar12 * 4) = *(float *)((long)&local_48 + lVar12 * 4) * 0.125;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  *(undefined8 *)(this->m_avg_color).m_s = local_48;
  fVar15 = (float)uVar10;
  uVar1 = *(undefined8 *)(this->m_avg_color).m_s;
  auVar19._0_4_ = fVar15 * (float)uVar1;
  auVar19._4_4_ = fVar15 * (float)((ulong)uVar1 >> 0x20);
  auVar19._8_4_ = fVar15 * 0.0;
  auVar19._12_4_ = fVar15 * 0.0;
  auVar19 = divps(auVar19,_DAT_001b0400);
  fVar18 = auVar19._0_4_ + 0.5;
  fVar20 = auVar19._4_4_ + 0.5;
  (this->m_avg_color).m_s[2] = local_40;
  uVar16 = (uint)fVar18;
  uVar17 = (uint)fVar20;
  uVar16 = (int)(fVar18 - 2.1474836e+09) & (int)uVar16 >> 0x1f | uVar16;
  uVar17 = (int)(fVar20 - 2.1474836e+09) & (int)uVar17 >> 0x1f | uVar17;
  this->m_br = ~-(uint)((int)uVar16 < 0) &
               (~-(uint)((int)uVar16 < (int)uVar10) & (uVar9 | 0xf) |
               uVar16 & -(uint)((int)uVar16 < (int)uVar10));
  this->m_bg = ~-(uint)((int)uVar17 < 0) &
               (~-(uint)((int)uVar17 < (int)uVar10) & (uVar9 | 0xf) |
               uVar17 & -(uint)((int)uVar17 < (int)uVar10));
  uVar9 = (uint)(long)((fVar15 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar9 < (int)uVar10) {
    uVar10 = uVar9;
  }
  uVar16 = 0;
  if (-1 < (int)uVar9) {
    uVar16 = uVar10;
  }
  this->m_bb = uVar16;
  if (*(int *)ctx < 2) {
    lVar12 = 0;
    puVar11 = indirect_radix_sort<unsigned_int,unsigned_short>
                        (8,*pIndices0,this->m_sorted_luma[1],pKeys,0,2,false);
    this->m_pSorted_luma_indices = puVar11;
    if ((uint32 (*) [8])puVar11 == pIndices0) {
      pIndices0 = this->m_sorted_luma + 1;
    }
    this->m_pSorted_luma = *pIndices0;
    do {
      (*pIndices0)[lVar12] = (uint)pKeys[puVar11[lVar12]];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& p, results& r)
        {
            // This version is hardcoded for 8 pixel subblocks.
            RG_ETC1_ASSERT(p.m_num_src_pixels == 8);

            m_pParams = &p;
            m_pResult = &r;

            const uint n = 8;

            m_limit = m_pParams->m_use_color4 ? 15 : 31;

            vec3F avg_color(0.0f);

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
                const vec3F fc(c.r, c.g, c.b);

                avg_color += fc;

                m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
                m_sorted_luma[0][i] = i;
            }
            avg_color *= (1.0f / static_cast<float>(n));
            m_avg_color = avg_color;

            m_br = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bg = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bb = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

            if (m_pParams->m_quality <= cMediumQuality)
            {
                m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0], m_sorted_luma[1], m_luma, 0, sizeof(m_luma[0]), false);
                m_pSorted_luma = m_sorted_luma[0];
                if (m_pSorted_luma_indices == m_sorted_luma[0])
                {
                    m_pSorted_luma = m_sorted_luma[1];
                }

                for (uint i = 0; i < n; i++)
                {
                    m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
                }
            }

            m_best_solution.m_coords.clear();
            m_best_solution.m_valid = false;
            m_best_solution.m_error = cUINT64_MAX;
        }